

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

void daemon_main(int listen_fd,int close_notify_fd,char *tempdir)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  uint local_60;
  int fd;
  int sock_fd;
  pthread_attr_t thattr;
  pthread_t tid;
  char *tempdir_local;
  int close_notify_fd_local;
  int listen_fd_local;
  
  tid = (pthread_t)tempdir;
  tempdir_local._0_4_ = close_notify_fd;
  tempdir_local._4_4_ = listen_fd;
  lVar3 = sysconf(4);
  local_60 = (uint)lVar3;
  while (local_60 = local_60 - 1, 2 < (int)local_60) {
    if ((local_60 != tempdir_local._4_4_) && (local_60 != (uint)tempdir_local)) {
      close(local_60);
    }
  }
  pthread_attr_init((pthread_attr_t *)&fd);
  pthread_attr_setdetachstate((pthread_attr_t *)&fd,1);
  iVar1 = pthread_create((pthread_t *)(thattr.__size + 0x30),(pthread_attr_t *)&fd,
                         daemon_close_notify_thread,(void *)(ulong)(uint)tempdir_local);
  if (iVar1 == 0) {
    do {
      do {
        uVar2 = accept(tempdir_local._4_4_,(sockaddr *)0x0,(socklen_t *)0x0);
      } while (uVar2 == 0xffffffff);
      iVar1 = pthread_create((pthread_t *)(thattr.__size + 0x30),(pthread_attr_t *)&fd,
                             daemon_conn_thread,(void *)(ulong)uVar2);
    } while (iVar1 == 0);
    dief("pthread_create failed");
  }
  dief("pthread_create failed");
}

Assistant:

__attribute__((noreturn)) static void daemon_main(int listen_fd, int close_notify_fd, const char *tempdir)
{
    pthread_t tid;
    pthread_attr_t thattr;
    int sock_fd;

    { /* close all descriptors (except STDIN, STDOUT, STRERR, listen_fd, close_notify_fd) */
        int fd = (int)sysconf(_SC_OPEN_MAX) - 1;
        for (; fd > 2; --fd) {
            if (fd == listen_fd || fd == close_notify_fd)
                continue;
            close(fd);
        }
    }

    pthread_attr_init(&thattr);
    pthread_attr_setdetachstate(&thattr, 1);

    if (pthread_create(&tid, &thattr, daemon_close_notify_thread, (char *)NULL + close_notify_fd) != 0)
        dief("pthread_create failed");

    while (1) {
        while ((sock_fd = accept(listen_fd, NULL, NULL)) == -1)
            ;
        if (pthread_create(&tid, &thattr, daemon_conn_thread, (char *)NULL + sock_fd) != 0)
            dief("pthread_create failed");
    }
}